

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-tree.h
# Opt level: O2

StringTree * __thiscall
kj::StringTree::concat<kj::FixedArray<char,1ul>,kj::FixedArray<char,1ul>,kj::FixedArray<char,1ul>>
          (StringTree *__return_storage_ptr__,StringTree *this,FixedArray<char,_1UL> *params,
          FixedArray<char,_1UL> *params_1,FixedArray<char,_1UL> *params_2)

{
  size_t sVar1;
  char *pcVar2;
  size_type extraout_RDX;
  size_type extraout_RDX_00;
  initializer_list<unsigned_long> nums;
  initializer_list<unsigned_long> nums_00;
  initializer_list<unsigned_long> nums_01;
  Array<kj::StringTree::Branch> local_60;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  (__return_storage_ptr__->branches).size_ = 0;
  (__return_storage_ptr__->branches).disposer = (ArrayDisposer *)0x0;
  (__return_storage_ptr__->text).content.disposer = (ArrayDisposer *)0x0;
  (__return_storage_ptr__->branches).ptr = (Branch *)0x0;
  (__return_storage_ptr__->text).content.ptr = (char *)0x0;
  (__return_storage_ptr__->text).content.size_ = 0;
  local_60.ptr = (Branch *)0x1;
  local_60.size_ = 1;
  local_60.disposer = (ArrayDisposer *)0x1;
  nums._M_len = (size_type)params;
  nums._M_array = (iterator)0x3;
  sVar1 = kj::_::sum((_ *)&local_60,nums);
  __return_storage_ptr__->size_ = sVar1;
  local_48 = 1;
  uStack_40 = 1;
  local_38 = 1;
  nums_00._M_len = extraout_RDX;
  nums_00._M_array = (iterator)0x3;
  sVar1 = kj::_::sum((_ *)&local_48,nums_00);
  heapString((String *)&local_60,sVar1);
  Array<char>::operator=(&(__return_storage_ptr__->text).content,(Array<char> *)&local_60);
  Array<char>::~Array((Array<char> *)&local_60);
  local_48 = 0;
  uStack_40 = 0;
  local_38 = 0;
  nums_01._M_len = extraout_RDX_00;
  nums_01._M_array = (iterator)0x3;
  sVar1 = kj::_::sum((_ *)&local_48,nums_01);
  local_60.ptr = kj::_::HeapArrayDisposer::allocate<kj::StringTree::Branch>(sVar1);
  local_60.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
  local_60.size_ = sVar1;
  Array<kj::StringTree::Branch>::operator=(&__return_storage_ptr__->branches,&local_60);
  Array<kj::StringTree::Branch>::~Array(&local_60);
  pcVar2 = (char *)(__return_storage_ptr__->text).content.size_;
  if (pcVar2 != (char *)0x0) {
    pcVar2 = (__return_storage_ptr__->text).content.ptr;
  }
  *pcVar2 = (char)this->size_;
  pcVar2[1] = params->content[0];
  pcVar2[2] = params_1->content[0];
  return __return_storage_ptr__;
}

Assistant:

StringTree StringTree::concat(Params&&... params) {
  StringTree result;
  result.size_ = _::sum({params.size()...});
  result.text = heapString(
      _::sum({StringTree::flatSize(kj::fwd<Params>(params))...}));
  result.branches = heapArray<StringTree::Branch>(
      _::sum({StringTree::branchCount(kj::fwd<Params>(params))...}));
  result.fill(result.text.begin(), 0, kj::fwd<Params>(params)...);
  return result;
}